

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_ext.cpp
# Opt level: O0

void ucnv_extWriteFromU(UConverter *cnv,int32_t *cx,uint32_t value,char **target,char *targetLimit,
                       int32_t **offsets,int32_t srcIndex,UErrorCode *pErrorCode)

{
  uint32_t uVar1;
  uint uVar2;
  char local_71;
  undefined1 *puStack_70;
  uint8_t shiftByte;
  uint8_t *p;
  int32_t prevLength;
  int32_t length;
  uint8_t *result;
  uint8_t buffer [32];
  int32_t **offsets_local;
  char *targetLimit_local;
  char **target_local;
  uint32_t value_local;
  int32_t *cx_local;
  UConverter *cnv_local;
  
  p._4_4_ = value >> 0x18 & 0x1f;
  uVar2 = value & 0xffffff;
  if (3 < p._4_4_) {
    _prevLength = (uint8_t **)((long)cx + (ulong)uVar2 + (long)cx[8]);
    goto LAB_004cd924;
  }
  puStack_70 = (undefined1 *)((long)&result + 1);
  if (p._4_4_ == 1) {
LAB_004cd8e5:
    *puStack_70 = (char)uVar2;
  }
  else {
    if (p._4_4_ == 2) {
LAB_004cd8cc:
      *puStack_70 = (char)(uVar2 >> 8);
      puStack_70 = puStack_70 + 1;
      goto LAB_004cd8e5;
    }
    if (p._4_4_ == 3) {
      result._1_1_ = (undefined1)(uVar2 >> 0x10);
      puStack_70 = (undefined1 *)((long)&result + 2);
      goto LAB_004cd8cc;
    }
  }
  _prevLength = (uint8_t **)((long)&result + 1);
LAB_004cd924:
  uVar1 = cnv->fromUnicodeStatus;
  buffer._24_8_ = offsets;
  if (uVar1 != 0) {
    if (((int)uVar1 < 2) || (p._4_4_ != 1)) {
      if ((uVar1 == 1) && (1 < p._4_4_)) {
        local_71 = '\x0e';
        cnv->fromUnicodeStatus = 2;
      }
      else {
        local_71 = '\0';
      }
    }
    else {
      local_71 = '\x0f';
      cnv->fromUnicodeStatus = 1;
    }
    if (local_71 != '\0') {
      result._0_1_ = local_71;
      if (_prevLength != (uint8_t **)((long)&result + 1)) {
        memcpy((void *)((long)&result + 1),_prevLength,(long)(int)p._4_4_);
      }
      _prevLength = &result;
      p._4_4_ = p._4_4_ + 1;
    }
  }
  ucnv_fromUWriteBytes_63
            (cnv,(char *)_prevLength,p._4_4_,target,targetLimit,(int32_t **)buffer._24_8_,srcIndex,
             pErrorCode);
  return;
}

Assistant:

static inline void
ucnv_extWriteFromU(UConverter *cnv, const int32_t *cx,
                   uint32_t value,
                   char **target, const char *targetLimit,
                   int32_t **offsets, int32_t srcIndex,
                   UErrorCode *pErrorCode) {
    uint8_t buffer[1+UCNV_EXT_MAX_BYTES];
    const uint8_t *result;
    int32_t length, prevLength;

    length=UCNV_EXT_FROM_U_GET_LENGTH(value);
    value=(uint32_t)UCNV_EXT_FROM_U_GET_DATA(value);

    /* output the result */
    if(length<=UCNV_EXT_FROM_U_MAX_DIRECT_LENGTH) {
        /*
         * Generate a byte array and then write it below.
         * This is not the fastest possible way, but it should be ok for
         * extension mappings, and it is much simpler.
         * Offset and overflow handling are only done once this way.
         */
        uint8_t *p=buffer+1; /* reserve buffer[0] for shiftByte below */
        switch(length) {
        case 3:
            *p++=(uint8_t)(value>>16);
            U_FALLTHROUGH;
        case 2:
            *p++=(uint8_t)(value>>8);
            U_FALLTHROUGH;
        case 1:
            *p++=(uint8_t)value;
            U_FALLTHROUGH;
        default:
            break; /* will never occur */
        }
        result=buffer+1;
    } else {
        result=UCNV_EXT_ARRAY(cx, UCNV_EXT_FROM_U_BYTES_INDEX, uint8_t)+value;
    }

    /* with correct data we have length>0 */

    if((prevLength=cnv->fromUnicodeStatus)!=0) {
        /* handle SI/SO stateful output */
        uint8_t shiftByte;

        if(prevLength>1 && length==1) {
            /* change from double-byte mode to single-byte */
            shiftByte=(uint8_t)UCNV_SI;
            cnv->fromUnicodeStatus=1;
        } else if(prevLength==1 && length>1) {
            /* change from single-byte mode to double-byte */
            shiftByte=(uint8_t)UCNV_SO;
            cnv->fromUnicodeStatus=2;
        } else {
            shiftByte=0;
        }

        if(shiftByte!=0) {
            /* prepend the shift byte to the result bytes */
            buffer[0]=shiftByte;
            if(result!=buffer+1) {
                uprv_memcpy(buffer+1, result, length);
            }
            result=buffer;
            ++length;
        }
    }

    ucnv_fromUWriteBytes(cnv, (const char *)result, length,
                         target, targetLimit,
                         offsets, srcIndex,
                         pErrorCode);
}